

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void P_CheckFakeFloorTriggers(AActor *mo,double oldz,bool oldz_has_viewheight)

{
  player_t *ppVar1;
  sector_t *psVar2;
  sector_t *psVar3;
  double *pdVar4;
  int iVar5;
  ASectorAction *pAVar6;
  double dVar7;
  double dVar8;
  
  ppVar1 = mo->player;
  if ((ppVar1 == (player_t *)0x0) || ((ppVar1->cheats & 0x2000) == 0)) {
    psVar2 = mo->Sector;
    if (psVar2 == (sector_t *)0x0) {
      __assert_fail("sec != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0xb90,"void P_CheckFakeFloorTriggers(AActor *, double, bool)");
    }
    psVar3 = psVar2->heightsec;
    if ((psVar3 != (sector_t *)0x0) &&
       (pAVar6 = (psVar2->SecActTarget).field_0.p, pAVar6 != (ASectorAction *)0x0)) {
      if (((pAVar6->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
        dVar7 = ((mo->__Pos).Y * (psVar3->floorplane).normal.Y +
                (psVar3->floorplane).D + (mo->__Pos).X * (psVar3->floorplane).normal.X) *
                (psVar3->floorplane).negiC;
        pdVar4 = &ppVar1->viewheight;
        if (ppVar1 == (player_t *)0x0) {
          pdVar4 = &mo->Height;
        }
        dVar8 = *pdVar4;
        if ((dVar7 < oldz) && ((mo->__Pos).Z <= dVar7)) {
          ASectorAction::TriggerAction(pAVar6,mo,0x400);
        }
        if (!oldz_has_viewheight) {
          oldz = oldz + dVar8;
        }
        dVar8 = dVar8 + (mo->__Pos).Z;
        if (((oldz <= dVar7) && (iVar5 = 0x80, dVar7 < dVar8)) ||
           ((dVar7 < oldz && (iVar5 = 0x40, dVar8 <= dVar7)))) {
          ASectorAction::TriggerAction((psVar2->SecActTarget).field_0.p,mo,iVar5);
        }
        if ((psVar3->MoreFlags & 2) == 0) {
          dVar7 = ((mo->__Pos).Y * (psVar3->ceilingplane).normal.Y +
                  (psVar3->ceilingplane).D + (mo->__Pos).X * (psVar3->ceilingplane).normal.X) *
                  (psVar3->ceilingplane).negiC;
          if ((dVar7 < oldz) || (dVar8 <= dVar7)) {
            if (oldz <= dVar7) {
              return;
            }
            if (dVar7 < dVar8) {
              return;
            }
            pAVar6 = (psVar2->SecActTarget).field_0.p;
            iVar5 = 0x100;
          }
          else {
            pAVar6 = (psVar2->SecActTarget).field_0.p;
            iVar5 = 0x200;
          }
          ASectorAction::TriggerAction(pAVar6,mo,iVar5);
          return;
        }
      }
      else {
        (psVar2->SecActTarget).field_0.p = (ASectorAction *)0x0;
      }
    }
  }
  return;
}

Assistant:

void P_CheckFakeFloorTriggers (AActor *mo, double oldz, bool oldz_has_viewheight)
{
	if (mo->player && (mo->player->cheats & CF_PREDICTING))
	{
		return;
	}
	sector_t *sec = mo->Sector;
	assert (sec != NULL);
	if (sec == NULL)
	{
		return;
	}
	if (sec->heightsec != NULL && sec->SecActTarget != NULL)
	{
		sector_t *hs = sec->heightsec;
		double waterz = hs->floorplane.ZatPoint(mo);
		double newz;
		double viewheight;

		if (mo->player != NULL)
		{
			viewheight = mo->player->viewheight;
		}
		else
		{
			viewheight = mo->Height;
		}

		if (oldz > waterz && mo->Z() <= waterz)
		{ // Feet hit fake floor
			sec->SecActTarget->TriggerAction (mo, SECSPAC_HitFakeFloor);
		}

		newz = mo->Z() + viewheight;
		if (!oldz_has_viewheight)
		{
			oldz += viewheight;
		}

		if (oldz <= waterz && newz > waterz)
		{ // View went above fake floor
			sec->SecActTarget->TriggerAction (mo, SECSPAC_EyesSurface);
		}
		else if (oldz > waterz && newz <= waterz)
		{ // View went below fake floor
			sec->SecActTarget->TriggerAction (mo, SECSPAC_EyesDive);
		}

		if (!(hs->MoreFlags & SECF_FAKEFLOORONLY))
		{
			waterz = hs->ceilingplane.ZatPoint(mo);
			if (oldz <= waterz && newz > waterz)
			{ // View went above fake ceiling
				sec->SecActTarget->TriggerAction (mo, SECSPAC_EyesAboveC);
			}
			else if (oldz > waterz && newz <= waterz)
			{ // View went below fake ceiling
				sec->SecActTarget->TriggerAction (mo, SECSPAC_EyesBelowC);
			}
		}
	}
}